

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

void ucnv_setSubstChars_63(UConverter *converter,char *mySubChar,int8_t len,UErrorCode *err)

{
  UBool UVar1;
  UErrorCode *err_local;
  int8_t len_local;
  char *mySubChar_local;
  UConverter *converter_local;
  
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    if ((converter->sharedData->staticData->maxBytesPerChar < len) ||
       (len < converter->sharedData->staticData->minBytesPerChar)) {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      memcpy(converter->subChars,mySubChar,(long)len);
      converter->subCharLen = len;
      converter->subChar1 = '\0';
    }
  }
  return;
}

Assistant:

U_CAPI void    U_EXPORT2
ucnv_setSubstChars (UConverter * converter,
                    const char *mySubChar,
                    int8_t len,
                    UErrorCode * err)
{
    if (U_FAILURE (*err))
        return;
    
    /*Makes sure that the subChar is within the codepages char length boundaries */
    if ((len > converter->sharedData->staticData->maxBytesPerChar)
     || (len < converter->sharedData->staticData->minBytesPerChar))
    {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    
    uprv_memcpy (converter->subChars, mySubChar, len); /*copies the subchars */
    converter->subCharLen = len;  /*sets the new len */

    /*
    * There is currently (2001Feb) no separate API to set/get subChar1.
    * In order to always have subChar written after it is explicitly set,
    * we set subChar1 to 0.
    */
    converter->subChar1 = 0;
    
    return;
}